

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnMemory
          (BinaryReaderInterp *this,Index index,Limits *limits,uint32_t page_size)

{
  Result RVar1;
  Enum EVar2;
  ulong uVar3;
  ulong uVar4;
  Location loc;
  undefined1 local_78 [16];
  anon_union_16_2_ecfd7102_for_Location_1 local_68;
  bool local_58;
  bool local_57;
  bool local_56;
  undefined4 local_55;
  undefined1 local_51;
  uint32_t local_50;
  MemoryDesc local_48;
  
  local_68.field_0.last_column = 0;
  local_78._0_8_ = (this->filename_)._M_len;
  local_78._8_8_ = (this->filename_)._M_str;
  local_68.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar1 = SharedValidator::OnMemory(&this->validator_,(Location *)local_78,limits,page_size);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    local_68.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)limits->initial;
    local_68._8_8_ = limits->max;
    local_58 = limits->has_max;
    local_57 = limits->is_shared;
    local_56 = limits->is_64;
    local_51 = limits->field_0x17;
    local_55 = *(undefined4 *)&limits->field_0x13;
    local_48.type.limits.has_max = limits->has_max;
    local_48.type.limits.is_shared = limits->is_shared;
    local_48.type.limits.is_64 = limits->is_64;
    local_48.type.limits._19_1_ = limits->field_0x13;
    local_78._8_4_ = 2;
    local_78._0_8_ = &PTR__ExternType_002461b0;
    local_50 = page_size;
    if ((local_58 & 1U) == 0) {
      if ((page_size ^ page_size - 1) <= page_size - 1) {
        abort();
      }
      uVar4 = -(ulong)(local_56 & 1) | 0xffffffff;
      uVar3 = uVar4 / page_size;
      local_68._8_8_ = (page_size * uVar3 - uVar4 != 0) + uVar3;
    }
    local_48.type.super_ExternType.kind = Memory;
    local_48.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002461b0;
    local_48.type.limits._23_1_ = local_51;
    local_48.type.limits._20_3_ = local_55._1_3_;
    local_48.type.page_size = page_size;
    local_48.type.limits.initial = (uint64_t)local_68.field_1.offset;
    local_48.type.limits.max = local_68._8_8_;
    std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::
    emplace_back<wabt::interp::MemoryDesc>(&this->module_->memories,&local_48);
    std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::push_back
              (&this->memory_types_,(value_type *)local_78);
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnMemory(Index index,
                                    const Limits* limits,
                                    uint32_t page_size) {
  CHECK_RESULT(validator_.OnMemory(GetLocation(), *limits, page_size));
  MemoryType memory_type{*limits, page_size};
  module_.memories.push_back(MemoryDesc{memory_type});
  memory_types_.push_back(memory_type);
  return Result::Ok;
}